

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O1

ref<immutable::transient_rrb<char,_false,_5>_> __thiscall
immutable::transient_rrb_push<char,false,5>
          (immutable *this,ref<immutable::transient_rrb<char,_false,_5>_> *trrb,char element)

{
  uint32_t *puVar1;
  guid_type guid;
  transient_rrb<char,_false,_5> *ptVar2;
  leaf_node<char,_false> *plVar3;
  internal_node<char,_false> *piVar4;
  rrb_size_table<false> *prVar5;
  byte bVar6;
  byte bVar7;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,false>> *prVar8;
  internal_node<char,_false> *p_node;
  tree_node<char,_false> *ptVar9;
  char *__function;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint32_t k;
  uint32_t uVar13;
  uint32_t empty_height;
  bool bVar14;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_tail;
  ref<immutable::rrb_details::tree_node<char,_false>_> temp;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb_details::internal_node<char,_false>_> local_58;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_50;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_48;
  transient_rrb<char,_false,_5> *local_40;
  ref<immutable::rrb_details::leaf_node<char,_false>_> local_38;
  
  rrb_details::check_transience<char,false,5>(trrb);
  ptVar2 = trrb->ptr;
  if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
    if ((ulong)ptVar2->tail_len < 0x20) {
      plVar3 = (ptVar2->tail).ptr;
      if (plVar3 != (leaf_node<char,_false> *)0x0) {
        plVar3->child[ptVar2->tail_len] = element;
        ptVar2 = trrb->ptr;
        if (ptVar2 == (transient_rrb<char,_false,_5> *)0x0) goto LAB_001442c1;
        ptVar2->cnt = ptVar2->cnt + 1;
        ptVar2->tail_len = ptVar2->tail_len + 1;
        plVar3 = (ptVar2->tail).ptr;
        if (plVar3 != (leaf_node<char,_false> *)0x0) {
          puVar1 = &plVar3->len;
          *puVar1 = *puVar1 + 1;
          *(transient_rrb<char,_false,_5> **)this = ptVar2;
          ptVar2->_ref_count = ptVar2->_ref_count + 1;
          return (ref<immutable::transient_rrb<char,_false,_5>_>)
                 (transient_rrb<char,_false,_5> *)this;
        }
      }
LAB_001442d8:
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<char, false>>::operator->() const [T = immutable::rrb_details::leaf_node<char, false>]"
      ;
      goto LAB_001442ed;
    }
    ptVar2->cnt = ptVar2->cnt + 1;
    guid = ptVar2->guid;
    local_38.ptr = (leaf_node<char,_false> *)malloc(0x38);
    (local_38.ptr)->type = LEAF_NODE;
    (local_38.ptr)->len = 0;
    (local_38.ptr)->child = (char *)(local_38.ptr + 1);
    (local_38.ptr)->guid = guid;
    *(char *)&local_38.ptr[1].type = element;
    (local_38.ptr)->len = 1;
    (local_38.ptr)->_ref_count = 1;
    ptVar2->tail_len = 1;
    local_50.ptr = (ptVar2->tail).ptr;
    if (local_50.ptr != (leaf_node<char,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&ptVar2->tail,&local_38);
    ptVar2 = trrb->ptr;
    if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
      piVar4 = (internal_node<char,_false> *)(ptVar2->root).ptr;
      if (piVar4 == (internal_node<char,_false> *)0x0) {
        ptVar2->shift = 0;
        if (local_50.ptr != (leaf_node<char,_false> *)0x0) {
          (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
        }
        local_48.ptr = (ptVar2->root).ptr;
        (ptVar2->root).ptr = (tree_node<char,_false> *)local_50.ptr;
        ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
        ptVar2 = trrb->ptr;
        *(transient_rrb<char,_false,_5> **)this = ptVar2;
        if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
          ptVar2->_ref_count = ptVar2->_ref_count + 1;
        }
        goto LAB_0014425e;
      }
      uVar13 = ptVar2->cnt;
      piVar4->_ref_count = piVar4->_ref_count + 1;
      uVar11 = uVar13 - 2;
      uVar13 = ptVar2->shift;
      empty_height = 0;
      k = 0;
      local_58.ptr = piVar4;
      local_40 = (transient_rrb<char,_false,_5> *)this;
      do {
        if (uVar13 < 6) {
          if (uVar13 == 0) {
            uVar13 = 0;
          }
          else {
            if (local_58.ptr == (internal_node<char,_false> *)0x0) goto LAB_001442aa;
            empty_height = empty_height + 1;
            if ((local_58.ptr)->len < 0x20) {
              k = empty_height;
            }
          }
          goto LAB_00144080;
        }
        if (local_58.ptr == (internal_node<char,_false> *)0x0) goto LAB_001442aa;
        prVar5 = ((local_58.ptr)->size_table).ptr;
        uVar12 = uVar11;
        if (prVar5 == (rrb_size_table<false> *)0x0) {
          bVar7 = (byte)uVar13;
          bVar6 = bVar7 + 5 & 0x1f;
          bVar14 = uVar11 >> bVar6 == 0;
          if (bVar14) {
            this = (immutable *)(ulong)(uVar11 >> (bVar7 & 0x1f) & 0x1f);
            uVar12 = uVar11 & ~(0x1f << (bVar7 & 0x1f));
          }
          else {
            empty_height = empty_height + 1;
          }
          bVar14 = !bVar14;
          uVar10 = uVar11 >> bVar6;
          uVar11 = uVar12;
          if (uVar10 == 0) goto LAB_00143fc1;
        }
        else {
          uVar10 = (local_58.ptr)->len - 1;
          this = (immutable *)(ulong)uVar10;
          if (uVar10 == 0) {
            this = (immutable *)0x0;
          }
          else {
            uVar12 = uVar11 - prVar5->size[(local_58.ptr)->len - 2];
          }
LAB_00143fc1:
          empty_height = empty_height + 1;
          if ((uint)this < 0x1f) {
            k = empty_height;
          }
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                    (&local_58,(local_58.ptr)->child + ((ulong)this & 0xffffffff));
          uVar11 = uVar12;
          if (local_58.ptr == (internal_node<char,_false> *)0x0) {
            bVar14 = true;
            k = empty_height;
          }
          else {
            uVar13 = uVar13 - 5;
            bVar14 = false;
          }
        }
      } while (!bVar14);
      this = (immutable *)local_40;
      if (bVar14) {
LAB_00144080:
        this = (immutable *)local_40;
        if (5 < uVar13) {
          empty_height = empty_height + (uVar13 - 6) / 5 + 1;
        }
        if (k == 0) {
          ptVar2 = trrb->ptr;
          if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
            piVar4 = (internal_node<char,_false> *)(ptVar2->root).ptr;
            if (piVar4 != (internal_node<char,_false> *)0x0) {
              piVar4->_ref_count = piVar4->_ref_count + 1;
            }
            p_node = (internal_node<char,_false> *)malloc(0x120);
            p_node->type = INTERNAL_NODE;
            p_node->len = 0;
            p_node->child = (ref<immutable::rrb_details::internal_node<char,_false>_> *)(p_node + 1)
            ;
            (p_node->size_table).ptr = (rrb_size_table<false> *)0x0;
            memset(p_node + 1,0,0x100);
            p_node->guid = guid;
            p_node->len = 2;
            p_node->_ref_count = 1;
            ref<immutable::rrb_details::internal_node<char,false>>::operator=
                      ((ref<immutable::rrb_details::internal_node<char,false>> *)p_node->child,
                       &ptVar2->root);
            ptVar2 = trrb->ptr;
            if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
              p_node->_ref_count = p_node->_ref_count + 1;
              local_48.ptr = (ptVar2->root).ptr;
              (ptVar2->root).ptr = (tree_node<char,_false> *)p_node;
              ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
              ptVar2 = trrb->ptr;
              if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
                ptVar2->shift = ptVar2->shift + 5;
                if (piVar4 == (internal_node<char,_false> *)0x0) {
LAB_001442aa:
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<char, false>>::operator->() const [T = immutable::rrb_details::internal_node<char, false>]"
                  ;
                  goto LAB_001442ed;
                }
                if ((piVar4->type != LEAF_NODE) &&
                   ((piVar4->size_table).ptr != (rrb_size_table<false> *)0x0)) {
                  ptVar9 = (tree_node<char,_false> *)malloc(0x90);
                  *(tree_node<char,_false> **)ptVar9 = ptVar9 + 1;
                  ptVar9->guid = guid;
                  if (local_50.ptr == (leaf_node<char,_false> *)0x0) goto LAB_001442d8;
                  ptVar9[1].type = ~(local_50.ptr)->len + ptVar2->cnt;
                  ptVar9[1].len = ptVar2->cnt - 1;
                  ptVar9->_ref_count = 1;
                  local_48.ptr = ptVar9;
                  ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                            (&p_node->size_table,
                             (ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_48);
                  if ((local_48.ptr != (tree_node<char,_false> *)0x0) &&
                     (uVar13 = (local_48.ptr)->_ref_count, (local_48.ptr)->_ref_count = uVar13 - 1,
                     uVar13 == 1)) {
                    free(local_48.ptr);
                  }
                }
                if (trrb->ptr != (transient_rrb<char,_false,_5> *)0x0) {
                  prVar8 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                           rrb_details::new_editable_path<char,false,5>
                                     ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                                      (*(long *)&(trrb->ptr->root).ptr[1]._ref_count + 8),
                                      empty_height,guid);
                  this = (immutable *)local_40;
                  ref<immutable::rrb_details::internal_node<char,false>>::operator=
                            (prVar8,&local_50);
                  rrb_details::release<char>(p_node);
                  rrb_details::release<char>(piVar4);
                  goto LAB_00144246;
                }
              }
            }
          }
          goto LAB_001442c1;
        }
        to_set = rrb_details::mutate_first_k<char,false,5>(trrb,k);
        prVar8 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,5>(to_set,empty_height - k,guid);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar8,&local_50);
LAB_00144246:
        ptVar2 = trrb->ptr;
        *(transient_rrb<char,_false,_5> **)this = ptVar2;
        if (ptVar2 != (transient_rrb<char,_false,_5> *)0x0) {
          ptVar2->_ref_count = ptVar2->_ref_count + 1;
        }
      }
      rrb_details::release<char>(local_58.ptr);
LAB_0014425e:
      if ((local_50.ptr != (leaf_node<char,_false> *)0x0) &&
         (uVar13 = (local_50.ptr)->_ref_count, (local_50.ptr)->_ref_count = uVar13 - 1, uVar13 == 1)
         ) {
        free(local_50.ptr);
      }
      if ((local_38.ptr != (leaf_node<char,_false> *)0x0) &&
         (uVar13 = (local_38.ptr)->_ref_count, (local_38.ptr)->_ref_count = uVar13 - 1, uVar13 == 1)
         ) {
        free(local_38.ptr);
      }
      return (ref<immutable::transient_rrb<char,_false,_5>_>)(transient_rrb<char,_false,_5> *)this;
    }
  }
LAB_001442c1:
  __function = 
  "T *immutable::ref<immutable::transient_rrb<char, false>>::operator->() const [T = immutable::transient_rrb<char, false>]"
  ;
LAB_001442ed:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> transient_rrb_push(ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, T element)
    {
    using namespace rrb_details;
    check_transience(trrb);
    if (trrb->tail_len < bits<N>::rrb_branching)
      {
      T* loc = (T*)((char*)trrb->tail->child + trrb->tail_len * sizeof(T));
      loc = new(loc) T(std::move(element)); // placement new      

      //trrb->tail->child[trrb->tail_len] = std::move(element);
      trrb->cnt++;
      trrb->tail_len++;
      trrb->tail->len++;
      // ^ consider deferring incrementing this until insertion and/or persistentified.
      return trrb;
      }

    trrb->cnt++;
    guid_type guid = trrb->guid;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = transient_leaf_node_create<T, atomic_ref_counting, N>();
    new_tail->guid = guid;
    
    T* loc = (T*)((char*)new_tail->child);
    loc = new(loc) T(std::move(element)); // placement new   

    //new_tail->child[0] = std::move(element);
    new_tail->len = 1;
    trrb->tail_len = 1;

    ref<leaf_node<T, atomic_ref_counting>> old_tail = trrb->tail;
    trrb->tail = new_tail;

    if (trrb->root.ptr == nullptr)
      { // If it's  null, we can't just mutate it down.
      trrb->shift = 0;
      trrb->root = old_tail;
      return trrb;
      }
    // mutable count starts here

    // TODO: Can find last rightmost jump in constant time for pvec subvecs:
    // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

    uint32_t index = trrb->cnt - 2;

    uint32_t nodes_to_mutate = 0;
    uint32_t nodes_visited = 0;
    uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                      // mutable node (or the element, if we can mutate the leaf)
    ref<internal_node<T, atomic_ref_counting>> current = trrb->root;

    uint32_t shift = trrb->shift;

    // checking all non-leaf nodes (or if tail, all but the lowest two levels)
    while (shift > bits<N>::rrb_bits)
      {
      // calculate child index
      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        // some check here to ensure we're not overflowing the pvec subvec.
        // important to realise that this only needs to be done once in a better
        // impl, the same way the size_table check only has to be done until it's
        // false.
        const uint32_t prev_shift = shift + bits<N>::rrb_bits;
        if (index >> prev_shift > 0)
          {
          nodes_visited++; // this could possibly be done earlier in the code.
          goto mutable_count_end;
          }
        child_index = (index >> shift) & bits<N>::rrb_mask;
        // index filtering is not necessary when the check above is performed at
        // most once.
        index &= ~(bits<N>::rrb_mask << shift);
        }
      else
        {
        // no need for sized_pos here, luckily.
        child_index = current->len - 1;
        // Decrement index
        if (child_index != 0)
          {
          index -= current->size_table->size[child_index - 1];
          }
        }
      nodes_visited++;
      if (child_index < bits<N>::rrb_mask)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;
        }

      current = current->child[child_index];
      // This will only happen in a pvec subtree
      if (current.ptr == nullptr)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;

        // if next element we're looking at is null, we can mutate all above. Good
        // times.
        goto mutable_count_end;
        }
      shift -= bits<N>::rrb_bits;
      }
    // if we're here, we're at the leaf node (or lowest non-leaf), which is
    // `current`

    // no need to even use index here: We know it'll be placed at current->len,
    // if there's enough space. That check is easy.
    if (shift != 0)
      {
      nodes_visited++;
      if (current->len < bits<N>::rrb_branching)
        {
        nodes_to_mutate = nodes_visited;
        pos = current->len;
        }
      }

  mutable_count_end:
    // GURRHH, nodes_visited is not yet handled nicely. loop down to get
    // nodes_visited set straight.
    while (shift > bits<N>::rrb_bits)
      {
      nodes_visited++;
      shift -= bits<N>::rrb_bits;
      }

    // Increasing height of tree.
    if (nodes_to_mutate == 0)
      {
      ref<internal_node<T, atomic_ref_counting>> old_root = trrb->root;
      ref<internal_node<T, atomic_ref_counting>> new_root = transient_internal_node_create<T, atomic_ref_counting, N>();
      new_root->guid = guid;
      new_root->len = 2;
      new_root->child[0] = trrb->root;
      trrb->root = new_root;
      trrb->shift = trrb->shift + bits<N>::rrb_bits;

      // create size table if the original rrb root has a size table.
      if (old_root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)old_root.ptr)->size_table.ptr != nullptr)
        {
        rrb_size_table<atomic_ref_counting>* table = transient_size_table_create<N, atomic_ref_counting>();
        table->guid = guid;
        table->size[0] = trrb->cnt - (old_tail->len + 1);
        // If we insert the tail, the old size minus (new size minus one) the old
        // tail size will be the amount of elements in the left branch. If there
        // is no tail, the size is just the old rrb-tree.

        table->size[1] = trrb->cnt - 1;
        // If we insert the tail, the old size would include the tail.
        // Consequently, it has to be the old size. If we have no tail, we append
        // a single element to the old vector, therefore it has to be one more
        // than the original (which means it is zero)

        new_root->size_table = table;
        }

      // nodes visited == original rrb tree height. Nodes visited > 0.
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(&((internal_node<T, atomic_ref_counting> *)trrb->root.ptr)->child[1], nodes_visited, guid);
      *to_set = old_tail;
      }
    else
      {
      ref<internal_node<T, atomic_ref_counting>>* node = mutate_first_k(trrb, nodes_to_mutate);
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(node, nodes_visited - nodes_to_mutate, guid);
      *to_set = old_tail;
      }

    return trrb;
    }